

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void ZSTD_updateRep(U32 *rep,U32 offBase,U32 ll0)

{
  uint uVar1;
  int in_EDX;
  uint in_ESI;
  int *in_RDI;
  U32 currentOffset;
  U32 repCode;
  int local_20;
  int local_1c;
  
  if (in_ESI < 4) {
    if ((in_ESI == 0) || (3 < in_ESI)) {
      __assert_fail("OFFBASE_IS_REPCODE(offBase)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x46c3,"void ZSTD_updateRep(U32 *, const U32, const U32)");
    }
    uVar1 = (in_ESI - 1) + in_EDX;
    if (uVar1 != 0) {
      if (uVar1 == 3) {
        local_1c = *in_RDI + -1;
      }
      else {
        local_1c = in_RDI[uVar1];
      }
      if (uVar1 < 2) {
        local_20 = in_RDI[2];
      }
      else {
        local_20 = in_RDI[1];
      }
      in_RDI[2] = local_20;
      in_RDI[1] = *in_RDI;
      *in_RDI = local_1c;
    }
  }
  else {
    in_RDI[2] = in_RDI[1];
    in_RDI[1] = *in_RDI;
    if (in_ESI < 4) {
      __assert_fail("OFFBASE_IS_OFFSET(offBase)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x46c1,"void ZSTD_updateRep(U32 *, const U32, const U32)");
    }
    *in_RDI = in_ESI - 3;
  }
  return;
}

Assistant:

MEM_STATIC void
ZSTD_updateRep(U32 rep[ZSTD_REP_NUM], U32 const offBase, U32 const ll0)
{
    if (OFFBASE_IS_OFFSET(offBase)) {  /* full offset */
        rep[2] = rep[1];
        rep[1] = rep[0];
        rep[0] = OFFBASE_TO_OFFSET(offBase);
    } else {   /* repcode */
        U32 const repCode = OFFBASE_TO_REPCODE(offBase) - 1 + ll0;
        if (repCode > 0) {  /* note : if repCode==0, no change */
            U32 const currentOffset = (repCode==ZSTD_REP_NUM) ? (rep[0] - 1) : rep[repCode];
            rep[2] = (repCode >= 2) ? rep[1] : rep[2];
            rep[1] = rep[0];
            rep[0] = currentOffset;
        } else {   /* repCode == 0 */
            /* nothing to do */
        }
    }
}